

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::cmMakefileLibraryTargetGenerator
          (cmMakefileLibraryTargetGenerator *this,cmGeneratorTarget *target)

{
  cmTarget *this_00;
  cmOSXBundleGenerator *this_01;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator)._vptr_cmMakefileTargetGenerator =
       (_func_int **)&PTR__cmMakefileLibraryTargetGenerator_00585408;
  (this->FrameworkVersion)._M_dataplus._M_p = (pointer)&(this->FrameworkVersion).field_2;
  (this->FrameworkVersion)._M_string_length = 0;
  (this->FrameworkVersion).field_2._M_local_buf[0] = '\0';
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  this_00 = (this->super_cmMakefileTargetGenerator).Target;
  if (this_00->TargetTypeValue != INTERFACE_LIBRARY) {
    cmTarget::GetLibraryNames
              (this_00,&(this->super_cmMakefileTargetGenerator).TargetNameOut,
               &(this->super_cmMakefileTargetGenerator).TargetNameSO,
               &(this->super_cmMakefileTargetGenerator).TargetNameReal,
               &(this->super_cmMakefileTargetGenerator).TargetNameImport,
               &(this->super_cmMakefileTargetGenerator).TargetNamePDB,
               &(this->super_cmMakefileTargetGenerator).ConfigName);
  }
  this_01 = (cmOSXBundleGenerator *)operator_new(0x40);
  cmOSXBundleGenerator::cmOSXBundleGenerator
            (this_01,target,&(this->super_cmMakefileTargetGenerator).ConfigName);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_01;
  this_01->MacContentFolders = &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileLibraryTargetGenerator
::cmMakefileLibraryTargetGenerator(cmGeneratorTarget* target):
  cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  if (this->Target->GetType() != cmTarget::INTERFACE_LIBRARY)
    {
    this->Target->GetLibraryNames(
      this->TargetNameOut, this->TargetNameSO, this->TargetNameReal,
      this->TargetNameImport, this->TargetNamePDB, this->ConfigName);
    }

  this->OSXBundleGenerator = new cmOSXBundleGenerator(target,
                                                      this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}